

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

void base64_encode_triplet_using_maps(base64_maps_t *maps,char *dest,char *src)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  char c;
  char b;
  char a;
  char *src_local;
  char *dest_local;
  base64_maps_t *maps_local;
  
  bVar1 = *src;
  bVar2 = src[1];
  bVar3 = src[2];
  cVar4 = sixbit_to_b64(maps,(uint8_t)((int)((int)(char)bVar1 & 0xfcU) >> 2));
  *dest = cVar4;
  cVar4 = sixbit_to_b64(maps,(bVar1 & 3) << 4 | (byte)((int)((int)(char)bVar2 & 0xf0U) >> 4));
  dest[1] = cVar4;
  cVar4 = sixbit_to_b64(maps,(byte)((int)((int)(char)bVar3 & 0xc0U) >> 6) | (bVar2 & 0xf) << 2);
  dest[2] = cVar4;
  cVar4 = sixbit_to_b64(maps,bVar3 & 0x3f);
  dest[3] = cVar4;
  return;
}

Assistant:

void base64_encode_triplet_using_maps(const base64_maps_t *maps,
				      char dest[4], const char src[3])
{
	char a = src[0];
	char b = src[1];
	char c = src[2];

	dest[0] = sixbit_to_b64(maps, (a & 0xfc) >> 2);
	dest[1] = sixbit_to_b64(maps, ((a & 0x3) << 4) | ((b & 0xf0) >> 4));
	dest[2] = sixbit_to_b64(maps, ((c & 0xc0) >> 6) | ((b & 0xf) << 2));
	dest[3] = sixbit_to_b64(maps, c & 0x3f);
}